

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O3

VkRenderingAttachmentInfoKHR * __thiscall
VulkanUtilities::RenderingInfoWrapper::GetDepthAttachment(RenderingInfoWrapper *this)

{
  uint uVar1;
  undefined8 in_RCX;
  bool bVar2;
  string msg;
  string local_30;
  
  bVar2 = (this->m_RI).pDepthAttachment == (VkRenderingAttachmentInfo *)0x0;
  uVar1 = this->m_DepthAttachmentIndex;
  if (uVar1 == 0xffffffff || bVar2) {
    Diligent::FormatString<char[26],char[66]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_RI.pDepthAttachment != nullptr && m_DepthAttachmentIndex != ~0u",
               (char (*) [66])CONCAT71((int7)((ulong)in_RCX >> 8),bVar2));
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetDepthAttachment",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x5a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    uVar1 = this->m_DepthAttachmentIndex;
  }
  return (this->m_Attachments)._M_t.
         super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl + uVar1;
}

Assistant:

VkRenderingAttachmentInfoKHR& GetDepthAttachment()
    {
        VERIFY_EXPR(m_RI.pDepthAttachment != nullptr && m_DepthAttachmentIndex != ~0u);
        return m_Attachments[m_DepthAttachmentIndex];
    }